

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

int sam_write1(htsFile *fp,bam_hdr_t *h,bam1_t *b)

{
  hFILE *fp_00;
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  ulong __n;
  size_t sVar4;
  ulong uVar5;
  size_t __size;
  
  switch((fp->format).format) {
  case binary_format:
    (fp->format).category = sequence_data;
    (fp->format).format = bam;
  case bam:
    iVar1 = bam_write1((fp->fp).bgzf,b);
    return iVar1;
  case text_format:
    break;
  case sam:
    goto switchD_0013d6a4_caseD_3;
  default:
    abort();
  case cram:
    iVar1 = cram_put_bam_seq((fp->fp).cram,b);
    return iVar1;
  }
  (fp->format).category = sequence_data;
  (fp->format).format = sam;
switchD_0013d6a4_caseD_3:
  iVar1 = sam_format1(h,b,&fp->line);
  if (iVar1 < 0) {
    return -1;
  }
  sVar4 = (fp->line).l;
  uVar2 = sVar4 + 1;
  if (uVar2 < (fp->line).m) {
    pcVar3 = (fp->line).s;
  }
  else {
    uVar2 = uVar2 >> 1 | uVar2;
    uVar2 = uVar2 >> 2 | uVar2;
    uVar2 = uVar2 >> 4 | uVar2;
    uVar2 = uVar2 >> 8 | uVar2;
    __size = (uVar2 >> 0x10 | uVar2) + 1;
    (fp->line).m = __size;
    pcVar3 = (char *)realloc((fp->line).s,__size);
    if (pcVar3 == (char *)0x0) goto LAB_0013d790;
    (fp->line).s = pcVar3;
    sVar4 = (fp->line).l;
    uVar2 = sVar4 + 1;
  }
  (fp->line).l = uVar2;
  pcVar3[sVar4] = '\n';
  (fp->line).s[(fp->line).l] = '\0';
LAB_0013d790:
  fp_00 = (fp->fp).hfile;
  uVar2 = (fp->line).l;
  pcVar3 = (fp->line).s;
  uVar5 = (long)fp_00->limit - (long)fp_00->begin;
  __n = uVar2;
  if (uVar5 < uVar2) {
    __n = uVar5;
  }
  memcpy(fp_00->begin,pcVar3,__n);
  fp_00->begin = fp_00->begin + __n;
  if (uVar5 < uVar2) {
    __n = hwrite2(fp_00,pcVar3,uVar2,__n);
  }
  sVar4 = (fp->line).l;
  iVar1 = -1;
  if (__n == sVar4) {
    iVar1 = (int)sVar4;
  }
  return iVar1;
}

Assistant:

int sam_write1(htsFile *fp, const bam_hdr_t *h, const bam1_t *b)
{
    switch (fp->format.format) {
    case binary_format:
        fp->format.category = sequence_data;
        fp->format.format = bam;
        /* fall-through */
    case bam:
        return bam_write1(fp->fp.bgzf, b);

    case cram:
        return cram_put_bam_seq(fp->fp.cram, (bam1_t *)b);

    case text_format:
        fp->format.category = sequence_data;
        fp->format.format = sam;
        /* fall-through */
    case sam:
        if (sam_format1(h, b, &fp->line) < 0) return -1;
        kputc('\n', &fp->line);
        if ( hwrite(fp->fp.hfile, fp->line.s, fp->line.l) != fp->line.l ) return -1;
        return fp->line.l;

    default:
        abort();
    }
}